

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-buy.c
# Opt level: O0

_Bool borg_think_shop_grab_interesting(void)

{
  _Bool _Var1;
  int32_t iVar2;
  wchar_t wVar3;
  int32_t iVar4;
  int iVar5;
  borg_item_conflict *item_00;
  borg_item_conflict *item;
  int hole;
  int32_t borg_empty_home_power;
  int32_t b_c;
  int32_t c;
  int32_t b_s;
  int32_t s;
  int charge_each;
  int qty;
  int b_n;
  int n;
  int b_k;
  int k;
  
  b_n = -1;
  charge_each = -1;
  s = 1;
  b_s = 0;
  c = 0;
  hole = 0;
  if (borg.trait[0x107] == 0) {
    if (borg.trait[0x23] < 0xf) {
      b_k._3_1_ = false;
    }
    else {
      borg_notice_home((borg_item_conflict *)0x0,true);
      iVar2 = borg_power_home();
      wVar3 = borg_first_empty_inventory_slot();
      if (wVar3 == L'\xffffffff') {
        b_k._3_1_ = false;
      }
      else if (wVar3 + L'\x01' < (int)((uint)z_info->pack_size - borg.trait[0x9e])) {
        borg_notice_home((borg_item_conflict *)0x0,false);
        b_c = borg_power_home();
        for (n = 0; n < (int)(z_info->store_max - 1); n = n + 1) {
          for (qty = 0; qty < (int)(uint)z_info->store_inven_max; qty = qty + 1) {
            item_00 = borg_shops[n].ware + qty;
            if (((item_00->iqty != '\0') && (_Var1 = borg_good_buy(item_00,n,qty), _Var1)) &&
               ((long)(item_00->cost * 5) + 1000 <= (long)borg.trait[0x2d])) {
              if ((item_00->tval == '\x16') || (item_00->tval == '\x17')) {
                b_s = (int)item_00->pval / (int)(uint)item_00->iqty;
              }
              memcpy(borg_items + wVar3,borg_shops[n].ware + qty,0x388);
              s = borg_min_item_quantity(item_00);
              borg_items[wVar3].iqty = (uint8_t)s;
              if ((item_00->tval == '\x16') || (item_00->tval == '\x17')) {
                borg_items[wVar3].pval = (short)b_s * (short)s;
              }
              borg_notice_home(borg_shops[n].ware + qty,false);
              iVar4 = borg_power_home();
              if ((iVar2 < iVar4) && (_Var1 = borg_think_home_sell_useful(&c), _Var1)) {
                iVar5 = item_00->cost * s;
                if (borg.trait[0x2d] / 10 < iVar5) {
                  c = c - iVar5;
                }
                if ((b_c <= c) && ((c != b_c || (iVar5 < hole)))) {
                  b_n = n;
                  charge_each = qty;
                  b_c = c;
                  hole = iVar5;
                }
              }
            }
          }
        }
        borg_items[wVar3].iqty = '\0';
        borg_notice_home((borg_item_conflict *)0x0,false);
        borg_power_home();
        borg.goal.item = -1;
        borg.goal.ware = -1;
        borg.goal.shop = -1;
        if ((b_n < 0) || (charge_each < 0)) {
          b_k._3_1_ = false;
        }
        else {
          borg.goal.shop = (int16_t)b_n;
          borg.goal.ware = (int16_t)charge_each;
          b_k._3_1_ = true;
        }
      }
      else {
        b_k._3_1_ = false;
      }
    }
  }
  else {
    b_k._3_1_ = false;
  }
  return b_k._3_1_;
}

Assistant:

bool borg_think_shop_grab_interesting(void)
{
    int k, b_k = -1;
    int n, b_n = -1;
    int qty   = 1;
    int charge_each = 0;

    int32_t s = 0L, b_s = 0L;
    int32_t c, b_c      = 0L;
    int32_t borg_empty_home_power;
    int     hole;

    /* Don't do this if Sauron is dead */
    if (borg.trait[BI_SAURON_DEAD])
        return false;

    /* not until later-- use that money for better equipment */
    if (borg.trait[BI_CLEVEL] < 15)
        return false;

    /* get what an empty home would have for power */
    borg_notice_home(NULL, true);
    borg_empty_home_power = borg_power_home();

    hole                  = borg_first_empty_inventory_slot();

    /* Require two empty slots */
    if (hole == -1)
        return false;
    if (hole + 1 >= PACK_SLOTS)
        return false;

    /* Examine the home */
    borg_notice_home(NULL, false);

    /* Evaluate the home */
    b_s = borg_power_home();

    /* Check the shops (max -1 to skip home) */
    for (k = 0; k < (z_info->store_max - 1); k++) {
        /* Scan the wares */
        for (n = 0; n < z_info->store_inven_max; n++) {
            borg_item *item = &borg_shops[k].ware[n];

            /* Skip empty items */
            if (!item->iqty)
                continue;

            /* Skip "bad" buys */
            if (!borg_good_buy(item, k, n))
                continue;

            /* Don't buy easy spell books late in the game */
            /* Hack -- Require some "extra" cash */
            if (borg.trait[BI_GOLD] < 1000L + item->cost * 5)
                continue;

            /* for wands and staffs adjust charges */
            if (item->tval == TV_STAFF || item->tval == TV_WAND)
                charge_each = item->pval / item->iqty;

            /* make this the next to last item that the player has */
            /* (can't make it the last or it thinks that both player and */
            /*  home are full) */
            memcpy(
                &borg_items[hole], &borg_shops[k].ware[n], sizeof(borg_item));

            /* Save the number */
            qty = borg_min_item_quantity(item);

            /* Give a single item */
            borg_items[hole].iqty = qty;

            /* for wands and staffs adjust charges */
            if (item->tval == TV_STAFF || item->tval == TV_WAND)
                borg_items[hole].pval = charge_each * qty;

            /* make sure this item would help an empty home */
            borg_notice_home(&borg_shops[k].ware[n], false);
            if (borg_empty_home_power >= borg_power_home())
                continue;

            /* optimize the home inventory */
            if (!borg_think_home_sell_useful(&s))
                continue;

            /* Obtain the "cost" of the item */
            c = item->cost * qty;

            /* Penalize expensive items */
            if (c > borg.trait[BI_GOLD] / 10)
                s -= c;

            /* Ignore "bad" sales */
            if (s < b_s)
                continue;

            /* Ignore "expensive" purchases */
            if ((s == b_s) && (c >= b_c))
                continue;

            /* Save the item and cost */
            b_k = k;
            b_n = n;
            b_s = s;
            b_c = c;
        }
    }

    /* restore inventory hole (just make sure the last slot goes back to */
    /* empty) */
    borg_items[hole].iqty = 0;

    /* Examine the real home */
    borg_notice_home(NULL, false);

    /* Evaluate the home */
    s = borg_power_home();

    /* remove the target that optimizing the home gave */
    borg.goal.shop = borg.goal.ware = borg.goal.item = -1;

    /* Buy something */
    if ((b_k >= 0) && (b_n >= 0)) {
        /* Visit that shop */
        borg.goal.shop = b_k;

        /* Buy that item */
        borg.goal.ware = b_n;

        /* Success */
        return true;
    }

    /* Nope */
    return false;
}